

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon_triangulation.cc
# Opt level: O2

void PolygonTriangulation::Triangulate
               (size_t num_contours,uint32_t *nvertices_per_contour,vertex_t *vertices,
               TriangleBuffer_t *triangles)

{
  uint __line;
  char *__assertion;
  PolygonTriangulation tri;
  
  if (num_contours == 0) {
    __assertion = "0u != num_contours";
    __line = 0xe;
  }
  else if (nvertices_per_contour == (uint32_t *)0x0) {
    __assertion = "nullptr != nvertices_per_contour";
    __line = 0xf;
  }
  else {
    if (vertices != (vertex_t *)0x0) {
      PolygonTriangulation(&tri,num_contours,nvertices_per_contour,vertices);
      trapezoidal_decomposition(&tri);
      monotone_partitioning(&tri);
      triangulate_monotone_polygons(&tri,triangles);
      ~PolygonTriangulation(&tri);
      return;
    }
    __assertion = "nullptr != vertices";
    __line = 0x10;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/tcoppex[P]polytri/src/polygon_triangulation.cc"
                ,__line,
                "static void PolygonTriangulation::Triangulate(const size_t, const uint32_t *, const vertex_t *, TriangleBuffer_t &)"
               );
}

Assistant:

void PolygonTriangulation::Triangulate(const size_t num_contours,
                                       const uint32_t nvertices_per_contour[],
                                       const vertex_t vertices[],
                                       TriangleBuffer_t &triangles)
{
  assert(0u != num_contours);
  assert(nullptr != nvertices_per_contour);
  assert(nullptr != vertices);

  PolygonTriangulation tri(num_contours, nvertices_per_contour, vertices);
  tri.trapezoidal_decomposition();
  tri.monotone_partitioning();
  tri.triangulate_monotone_polygons(triangles);
}